

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# includeLoopRecognition.cpp
# Opt level: O2

string * realFilename(string *__return_storage_ptr__,string *file)

{
  char __lhs;
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = (uint)file->_M_string_length;
  while( true ) {
    uVar1 = uVar1 - 1;
    if (((int)uVar1 < 0) || (__lhs = (file->_M_dataplus)._M_p[uVar1 & 0x7fffffff], __lhs == '/'))
    break;
    std::operator+(&local_40,__lhs,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string realFilename(std::string file) {
    std::string filename;
    for (int i = file.size() - 1; i >= 0; --i) {
        char c = file[i];
        if (c == '/') {
            break;
        }
        filename = c + filename;
    }
    return filename;
}